

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

bool __thiscall pbrt::BilinearPatch::IsRectangle(BilinearPatch *this)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  Tuple3<pbrt::Point3,_float> *this_00;
  Tuple3<pbrt::Point3,_float> *this_01;
  Tuple3<pbrt::Point3,_float> *this_02;
  Tuple3<pbrt::Point3,_float> *this_03;
  undefined1 auVar9 [16];
  type tVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 extraout_var [56];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  Vector3<float> VVar24;
  Point3<float> PVar25;
  Tuple3<pbrt::Vector3,_float> local_78;
  float local_6c;
  Tuple3<pbrt::Vector3,_float> local_60;
  Tuple3<pbrt::Vector3,_float> local_50;
  Tuple3<pbrt::Normal3,_float> local_40;
  undefined1 auVar23 [56];
  
  auVar23 = in_ZMM0._8_56_;
  lVar3 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar4 = *(long *)(lVar3 + 0x10);
  lVar7 = (long)this->blpIndex * 0x10;
  lVar3 = *(long *)(lVar3 + 0x18);
  iVar1 = *(int *)(lVar4 + 4 + lVar7);
  iVar2 = *(int *)(lVar4 + 0xc + lVar7);
  this_01 = (Tuple3<pbrt::Point3,_float> *)((long)*(int *)(lVar4 + lVar7) * 0xc + lVar3);
  this_03 = (Tuple3<pbrt::Point3,_float> *)((long)*(int *)(lVar4 + 8 + lVar7) * 0xc + lVar3);
  bVar6 = Tuple3<pbrt::Point3,_float>::operator==(this_01,(Point3<float> *)this_03);
  if (!bVar6) {
    this_02 = (Tuple3<pbrt::Point3,_float> *)((long)iVar2 * 0xc + lVar3);
    bVar6 = Tuple3<pbrt::Point3,_float>::operator==(this_03,(Point3<float> *)this_02);
    if (!bVar6) {
      this_00 = (Tuple3<pbrt::Point3,_float> *)(lVar3 + (long)iVar1 * 0xc);
      bVar6 = Tuple3<pbrt::Point3,_float>::operator==(this_02,(Point3<float> *)this_00);
      if ((!bVar6) &&
         (bVar6 = Tuple3<pbrt::Point3,_float>::operator==(this_00,(Point3<float> *)this_01), !bVar6)
         ) {
        VVar24 = Point3<float>::operator-((Point3<float> *)this_00,(Point3<float> *)this_01);
        local_60.z = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar14._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar14._8_56_ = auVar23;
        local_60._0_8_ = vmovlps_avx(auVar14._0_16_);
        VVar24 = Point3<float>::operator-((Point3<float> *)this_03,(Point3<float> *)this_01);
        local_50.z = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar15._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar15._8_56_ = auVar23;
        local_50._0_8_ = vmovlps_avx(auVar15._0_16_);
        VVar24 = Cross<float>((Vector3<float> *)&local_60,(Vector3<float> *)&local_50);
        local_78.z = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar16._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar16._8_56_ = auVar23;
        local_78._0_8_ = vmovlps_avx(auVar16._0_16_);
        VVar24 = Normalize<float>((Vector3<float> *)&local_78);
        local_40.z = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar17._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar17._8_56_ = auVar23;
        local_40._0_8_ = vmovlps_avx(auVar17._0_16_);
        VVar24 = Point3<float>::operator-((Point3<float> *)this_02,(Point3<float> *)this_01);
        local_60.z = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar18._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar18._8_56_ = auVar23;
        local_60._0_8_ = vmovlps_avx(auVar18._0_16_);
        VVar24 = Normalize<float>((Vector3<float> *)&local_60);
        local_78.z = VVar24.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar19._0_8_ = VVar24.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar19._8_56_ = auVar23;
        local_78._0_8_ = vmovlps_avx(auVar19._0_16_);
        tVar10 = AbsDot<float>((Vector3<float> *)&local_78,(Normal3<float> *)&local_40);
        if (tVar10 <= 1e-05) {
          auVar23 = extraout_var;
          PVar25 = Tuple3<pbrt::Point3,float>::operator+(this_01,(Point3<float> *)this_03);
          local_50.z = PVar25.super_Tuple3<pbrt::Point3,_float>.z;
          auVar20._0_8_ = PVar25.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar20._8_56_ = auVar23;
          local_50._0_8_ = vmovlps_avx(auVar20._0_16_);
          PVar25 = Tuple3<pbrt::Point3,float>::operator+
                             ((Tuple3<pbrt::Point3,_float> *)&local_50,(Point3<float> *)this_00);
          local_78.z = PVar25.super_Tuple3<pbrt::Point3,_float>.z;
          auVar21._0_8_ = PVar25.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar21._8_56_ = auVar23;
          local_78._0_8_ = vmovlps_avx(auVar21._0_16_);
          PVar25 = Tuple3<pbrt::Point3,float>::operator+
                             ((Tuple3<pbrt::Point3,_float> *)&local_78,(Point3<float> *)this_02);
          auVar22._0_8_ = PVar25.super_Tuple3<pbrt::Point3,_float>._0_8_;
          auVar22._8_56_ = auVar23;
          auVar9._8_4_ = 0x3e800000;
          auVar9._0_8_ = 0x3e8000003e800000;
          auVar9._12_4_ = 0x3e800000;
          auVar9 = vmulps_avx512vl(auVar22._0_16_,auVar9);
          local_60.z = PVar25.super_Tuple3<pbrt::Point3,_float>.z * 0.25;
          local_60._0_8_ = vmovlps_avx(auVar9);
          fVar11 = DistanceSquared<float>((Point3<float> *)this_01,(Point3<float> *)&local_60);
          fVar12 = DistanceSquared<float>((Point3<float> *)this_03,(Point3<float> *)&local_60);
          local_78.y = fVar12;
          local_78.z = DistanceSquared<float>((Point3<float> *)this_00,(Point3<float> *)&local_60);
          local_6c = DistanceSquared<float>((Point3<float> *)this_02,(Point3<float> *)&local_60);
          auVar13._8_4_ = 0x7fffffff;
          auVar13._0_8_ = 0x7fffffff7fffffff;
          auVar13._12_4_ = 0x7fffffff;
          uVar5 = 1;
          do {
            uVar8 = uVar5;
            if (uVar8 == 4) break;
            auVar9 = vandps_avx(ZEXT416((uint)((&local_78.x)[uVar8] - fVar11)),auVar13);
            uVar5 = uVar8 + 1;
          } while (auVar9._0_4_ / fVar11 <= 0.0001);
          return 3 < uVar8;
        }
      }
    }
  }
  return false;
}

Assistant:

PBRT_CPU_GPU
    const BilinearPatchMesh *GetMesh() const {
#ifdef PBRT_IS_GPU_CODE
        return (*allBilinearMeshesGPU)[meshIndex];
#else
        return (*allMeshes)[meshIndex];
#endif
    }